

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void createFloorGridMesh(void)

{
  int j;
  int iVar1;
  int i;
  int iVar2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> verts;
  u32 vbo [2];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_78;
  undefined4 uStack_74;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_70;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_68;
  int local_64;
  float local_60;
  int local_5c;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> local_58;
  GLuint local_38;
  GLuint local_34;
  
  (*glad_debug_glGenVertexArrays)(2,&gpu::floorGridVao);
  (*glad_debug_glGenBuffers)(2,&local_38);
  (*glad_debug_glBindVertexArray)(gpu::floorGridVao);
  (*glad_debug_glBindBuffer)(0x8892,local_38);
  local_58._capacity = 0;
  local_58._data = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_58._size = 0;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::reserve(&local_58,0x194);
  local_78.x = -1.0;
  uStack_74 = 0;
  local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
  local_78.x = 1.0;
  uStack_74 = 0;
  local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
  local_78.x = 0.0;
  uStack_74 = 0;
  local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
  local_78.x = 0.0;
  uStack_74 = 0;
  local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
  iVar2 = 1;
  do {
    aVar4.x = (float)iVar2 * -0.02;
    local_78.x = -1.0;
    uStack_74 = 0;
    local_70.x = aVar4.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    local_78.x = 1.0;
    uStack_74 = 0;
    local_70.x = aVar4.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    aVar3.x = (float)iVar2 * 0.02;
    local_78.x = -1.0;
    uStack_74 = 0;
    local_70.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    local_78.x = 1.0;
    uStack_74 = 0;
    local_70.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    uStack_74 = 0;
    local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
    local_78.x = aVar4.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    uStack_74 = 0;
    local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_78.x = aVar4.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    uStack_74 = 0;
    local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
    local_78.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    uStack_74 = 0;
    local_70 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_78.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_78);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x33);
  (*glad_debug_glBufferData)(0x8892,local_58._size * 0xc,local_58._data,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  (*glad_debug_glBindVertexArray)(DAT_003e8aec);
  (*glad_debug_glBindBuffer)(0x8892,local_34);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::resize<>(&local_58,0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::reserve(&local_58,0xaf0);
  iVar2 = 0;
  do {
    local_60 = (float)iVar2;
    iVar1 = 1;
    local_5c = iVar2;
    do {
      local_78.x = -NAN;
      local_64 = 0;
      aVar3.x = local_60 * -0.02 - (float)iVar1 * 0.0025;
      local_68.x = aVar3.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,(int *)&local_78,&local_64
                 ,&local_68.x);
      local_78.x = 1.4013e-45;
      local_64 = 0;
      local_68.x = aVar3.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,(int *)&local_78,&local_64
                 ,&local_68.x);
      local_78.x = -NAN;
      local_64 = 0;
      aVar4.x = local_60 * 0.02 + (float)iVar1 * 0.0025;
      local_68.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,(int *)&local_78,&local_64
                 ,&local_68.x);
      local_78.x = 1.4013e-45;
      local_64 = 0;
      local_68.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,(int *)&local_78,&local_64
                 ,&local_68.x);
      local_64 = 0;
      local_68.x = -NAN;
      local_78.x = aVar3.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,&local_78.x,&local_64,
                 (int *)&local_68);
      local_64 = 0;
      local_68.x = 1.4013e-45;
      local_78.x = aVar3.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,&local_78.x,&local_64,
                 (int *)&local_68);
      local_64 = 0;
      local_68.x = -NAN;
      local_78.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,&local_78.x,&local_64,
                 (int *)&local_68);
      local_64 = 0;
      local_68.x = 1.4013e-45;
      local_78.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&local_58,&local_78.x,&local_64,
                 (int *)&local_68);
      iVar1 = iVar1 + 1;
    } while (iVar1 != 8);
    iVar2 = local_5c + 1;
  } while (iVar2 != 0x32);
  (*glad_debug_glBufferData)(0x8892,local_58._size * 0xc,local_58._data,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (local_58._data != (vec<3,_float,_(glm::qualifier)0> *)0x0) {
    operator_delete__(local_58._data);
  }
  return;
}

Assistant:

void createFloorGridMesh()
{
    glGenVertexArrays(2, gpu::floorGridVao);
    u32 vbo[2];
    glGenBuffers(2, vbo);

    // thick lines
    glBindVertexArray(gpu::floorGridVao[0]);
    glBindBuffer(GL_ARRAY_BUFFER, vbo[0]);
    tl::Vector<vec3> verts;
    constexpr int n = FLOOR_GRID_RESOLUTION;
    verts.reserve(4 + 8*n);
    // fist the 2 lines that pass though the origin
    verts.push_back({-1, 0, 0});
    verts.push_back({+1, 0, 0});
    verts.push_back({0, 0, -1});
    verts.push_back({0, 0, +1});
    // the rest of the lines
    const float d = float(1) / n; // distance between lines
    for(int i = 1; i <= n; i++) {
        verts.push_back({-1, 0, -d*i});
        verts.push_back({+1, 0, -d*i});
        verts.push_back({-1, 0, +d*i});
        verts.push_back({+1, 0, +d*i});

        verts.push_back({-d*i, 0, -1});
        verts.push_back({-d*i, 0, +1});
        verts.push_back({+d*i, 0, -1});
        verts.push_back({+d*i, 0, +1});
    }
    glBufferData(GL_ARRAY_BUFFER, verts.size() * sizeof(vec3), verts.data(), GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, nullptr);

    // subdivisions
    glBindVertexArray(gpu::floorGridVao[1]);
    glBindBuffer(GL_ARRAY_BUFFER, vbo[1]);

    const int m = FLOOR_GRID_SUBDIVS;
    const float dd = d / m;
    verts.resize(0);
    verts.reserve(8*n*(m-1));
    for(int i = 0; i < n; i++)
    for(int j = 1; j < m; j++) {
        verts.emplace_back(-1, 0, -d*i - dd*j);
        verts.emplace_back(+1, 0, -d*i - dd*j);
        verts.emplace_back(-1, 0, +d*i + dd*j);
        verts.emplace_back(+1, 0, +d*i + dd*j);

        verts.emplace_back(-d*i - dd*j, 0, -1);
        verts.emplace_back(-d*i - dd*j, 0, +1);
        verts.emplace_back(+d*i + dd*j, 0, -1);
        verts.emplace_back(+d*i + dd*j, 0, +1);
    }
    glBufferData(GL_ARRAY_BUFFER, verts.size() * sizeof(vec3), verts.data(), GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, nullptr);
}